

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

size_t __thiscall
booster::locale::impl_icu::number_format<char>::do_parse<int>
          (number_format<char> *this,string_type *str,int *v)

{
  undefined1 uVar1;
  int32_t iVar2;
  UnicodeString *end;
  char_type *begin;
  size_t n;
  undefined4 *in_RDX;
  UnicodeString *in_RDI;
  size_t cut;
  int tmp_v;
  UnicodeString tmp;
  ParsePosition pp;
  Formattable val;
  Formattable *in_stack_fffffffffffffea8;
  ParsePosition *in_stack_fffffffffffffeb0;
  number_format<char> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffed8;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char_type *in_stack_ffffffffffffff10;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff18;
  ParsePosition local_a0 [16];
  Formattable local_90 [112];
  undefined4 *local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  icu_70::Formattable::Formattable(local_90);
  icu_70::ParsePosition::ParsePosition(in_stack_fffffffffffffeb0);
  end = in_RDI + 8;
  begin = (char_type *)std::__cxx11::string::data();
  n = std::__cxx11::string::data();
  std::__cxx11::string::size();
  icu_std_converter<char,_1>::icu
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (char_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  (**(code **)(**(long **)(in_RDI + 0x38) + 0xa0))
            (*(long **)(in_RDI + 0x38),&stack0xffffffffffffff10,local_90,local_a0);
  iVar2 = icu_70::ParsePosition::getIndex(local_a0);
  if ((iVar2 == 0) ||
     (uVar1 = get_value(in_stack_fffffffffffffeb8,(int32_t *)in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8), !(bool)uVar1)) {
    local_8 = 0;
  }
  else {
    std::__cxx11::string::data();
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    icu_70::ParsePosition::getIndex(local_a0);
    local_8 = icu_std_converter<char,_1>::cut
                        (in_stack_ffffffffffffff00,in_RDI,begin,(char_type *)end,n,
                         CONCAT17(uVar1,in_stack_fffffffffffffed8),(size_t)in_stack_ffffffffffffff10
                        );
    if (local_8 == 0) {
      local_8 = 0;
    }
    else {
      *local_20 = in_stack_ffffffffffffff0c;
    }
  }
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&stack0xffffffffffffff10);
  icu_70::ParsePosition::~ParsePosition(local_a0);
  icu_70::Formattable::~Formattable(local_90);
  return local_8;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &v) const
            {
                icu::Formattable val;
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data()+str.size());

                icu_fmt_->parse(tmp,val,pp);

                ValueType tmp_v;

                if(pp.getIndex() == 0 || !get_value(tmp_v,val))
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                v=tmp_v;
                return cut;
            }